

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ITypeReader.h
# Opt level: O0

void __thiscall ITypeReader::ITypeReader(ITypeReader *this,ifstream *ifs,ostream *os,int deep)

{
  int deep_local;
  ostream *os_local;
  ifstream *ifs_local;
  ITypeReader *this_local;
  
  IAbstractReader::IAbstractReader(&this->super_IAbstractReader,ifs,os,deep,false);
  (this->super_IAbstractReader)._vptr_IAbstractReader = (_func_int **)&PTR_getWord_00122ae8;
  std::__cxx11::string::string((string *)&this->m_last);
  std::__cxx11::string::operator=((string *)&(this->super_IAbstractReader).m_dataType,"Type");
  std::__cxx11::string::operator=((string *)&this->m_last,"");
  return;
}

Assistant:

explicit ITypeReader(std::ifstream* ifs,std::ostream* os,int deep) : IAbstractReader(ifs, os, deep) {
        m_dataType = "Type";
        m_last="";
    }